

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void Cmd_listlights(FCommandLine *argv,APlayerPawn *who,int key)

{
  ushort uVar1;
  FTextureID texnum;
  ADynamicLight *this;
  AActor *pAVar2;
  MetaClass *pMVar3;
  FTexture *pFVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  char *local_70;
  FLightNode *local_68;
  FLightNode *node;
  undefined1 local_58 [4];
  FTextureID spr;
  TThinkerIterator<ADynamicLight> it;
  ADynamicLight *dl;
  int i;
  int allsubsecs;
  int allsectors;
  int allwalls;
  int subsecs;
  int sectors;
  int walls;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  allsubsecs = 0;
  i = 0;
  dl._4_4_ = 0;
  dl._0_4_ = 0;
  TThinkerIterator<ADynamicLight>::TThinkerIterator
            ((TThinkerIterator<ADynamicLight> *)local_58,0x80);
  while( true ) {
    this = TThinkerIterator<ADynamicLight>::Next((TThinkerIterator<ADynamicLight> *)local_58);
    if (this == (ADynamicLight *)0x0) break;
    subsecs = 0;
    allwalls = 0;
    allsectors = 0;
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AActor).target);
    if (pAVar2 == (AActor *)0x0) {
      pMVar3 = AActor::GetClass(&this->super_AActor);
      local_70 = FName::GetChars(&(pMVar3->super_PClass).super_PStruct.super_PNamedType.TypeName);
    }
    else {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
      pMVar3 = AActor::GetClass(pAVar2);
      local_70 = FName::GetChars(&(pMVar3->super_PClass).super_PStruct.super_PNamedType.TypeName);
    }
    dVar6 = AActor::X(&this->super_AActor);
    dVar7 = AActor::Y(&this->super_AActor);
    dVar8 = AActor::Z(&this->super_AActor);
    Printf("%s at (%f, %f, %f), color = 0x%02x%02x%02x, radius = %f ",dVar6,dVar7,SUB84(dVar8,0),
           (this->super_AActor).radius,local_70,(ulong)(uint)(this->super_AActor).args[0],
           (ulong)(uint)(this->super_AActor).args[1],(ulong)(uint)(this->super_AActor).args[2]);
    dl._0_4_ = (uint)dl + 1;
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AActor).target);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
      uVar1 = pAVar2->sprite;
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_AActor).target);
      texnum = gl_GetSpriteFrame((uint)uVar1,(uint)pAVar2->frame,0,0,(bool *)0x0);
      pFVar4 = FTextureManager::operator[](&TexMan,texnum);
      pcVar5 = FString::GetChars(&pFVar4->Name);
      Printf(", frame = %s ",pcVar5);
    }
    for (local_68 = this->touching_sides; local_68 != (FLightNode *)0x0;
        local_68 = local_68->nextTarget) {
      subsecs = subsecs + 1;
      allsubsecs = allsubsecs + 1;
    }
    for (local_68 = this->touching_subsectors; local_68 != (FLightNode *)0x0;
        local_68 = local_68->nextTarget) {
      dl._4_4_ = dl._4_4_ + 1;
      allsectors = allsectors + 1;
    }
    for (local_68 = this->touching_sector; local_68 != (FLightNode *)0x0;
        local_68 = local_68->nextTarget) {
      i = i + 1;
      allwalls = allwalls + 1;
    }
    Printf("- %d walls, %d subsectors, %d sectors\n",(ulong)(uint)subsecs,(ulong)(uint)allsectors,
           (ulong)(uint)allwalls);
  }
  Printf("%i dynamic lights, %d walls, %d subsectors, %d sectors\n\n\n",(ulong)(uint)dl,
         (ulong)(uint)allsubsecs,(ulong)dl._4_4_,(ulong)(uint)i);
  return;
}

Assistant:

CCMD(listlights)
{
	int walls, sectors, subsecs;
	int allwalls=0, allsectors=0, allsubsecs = 0;
	int i=0;
	ADynamicLight * dl;
	TThinkerIterator<ADynamicLight> it;

	while ((dl=it.Next()))
	{
		walls=0;
		sectors=0;
		subsecs = 0;
		Printf("%s at (%f, %f, %f), color = 0x%02x%02x%02x, radius = %f ",
			dl->target? dl->target->GetClass()->TypeName.GetChars() : dl->GetClass()->TypeName.GetChars(),
			dl->X(), dl->Y(), dl->Z(), dl->args[LIGHT_RED], 
			dl->args[LIGHT_GREEN], dl->args[LIGHT_BLUE], dl->radius);
		i++;

		if (dl->target)
		{
			FTextureID spr = gl_GetSpriteFrame(dl->target->sprite, dl->target->frame, 0, 0, NULL);
			Printf(", frame = %s ", TexMan[spr]->Name.GetChars());
		}


		FLightNode * node;

		node=dl->touching_sides;

		while (node)
		{
			walls++;
			allwalls++;
			node = node->nextTarget;
		}

		node=dl->touching_subsectors;

		while (node)
		{
			allsubsecs++;
			subsecs++;
			node = node->nextTarget;
		}

		node = dl->touching_sector;

		while (node)
		{
			allsectors++;
			sectors++;
			node = node->nextTarget;
		}
		Printf("- %d walls, %d subsectors, %d sectors\n", walls, subsecs, sectors);

	}
	Printf("%i dynamic lights, %d walls, %d subsectors, %d sectors\n\n\n", i, allwalls, allsubsecs, allsectors);
}